

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuMaybe.hpp
# Opt level: O2

bool deqp::gles31::Functional::anon_unknown_0::requiresAdvancedBlendEq
               (BlendState *pre,BlendState *post,
               vector<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
               *drawBuffers)

{
  Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq> *pEVar1;
  pointer pDVar2;
  char *pcVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  
  pEVar1 = (pre->blendEq).m_ptr;
  if (((pEVar1 == (Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>
                   *)0x0) || (pEVar1->m_isFirst != true)) ||
     (uVar4 = *(pEVar1->field_1).m_first - 0x9294, 0x1c < uVar4)) {
    uVar4 = 0;
  }
  else {
    uVar4 = 0x1e0015ff >> ((byte)uVar4 & 0x1f);
  }
  pEVar1 = (post->blendEq).m_ptr;
  if ((pEVar1 != (Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>
                  *)0x0) && (pEVar1->m_isFirst == true)) {
    uVar5 = *(pEVar1->field_1).m_first - 0x9294;
    uVar4 = (uint)(byte)((byte)uVar4 | (byte)(0x1e0015ff >> ((byte)uVar5 & 0x1f)) & uVar5 < 0x1d);
  }
  pDVar2 = (drawBuffers->
           super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar6 = (ulong)((long)(drawBuffers->
                        super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
                        )._M_impl.super__Vector_impl_data._M_finish - (long)pDVar2) >> 7;
  uVar8 = 0;
  uVar7 = uVar6 & 0xffffffff;
  if ((int)uVar6 < 1) {
    uVar7 = uVar8;
  }
  for (; uVar7 * 0x80 != uVar8; uVar8 = uVar8 + 0x80) {
    pcVar3 = *(char **)((long)(&pDVar2->m_size + 4) + uVar8 + 4);
    if ((pcVar3 != (char *)0x0) && (*pcVar3 == '\x01')) {
      uVar4 = (uint)(byte)((byte)uVar4 |
                          (byte)(0x1e0015ff >> ((byte)(**(int **)(pcVar3 + 8) - 0x9294U) & 0x1f)) &
                          **(int **)(pcVar3 + 8) - 0x9294U < 0x1d);
    }
  }
  return (bool)((byte)uVar4 & 1);
}

Assistant:

operator bool	(void) const { return !!m_ptr; }